

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

string * __thiscall
diligent_spirv_cross::
join<char_const(&)[6],diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>&,char_const(&)[15]>
          (string *__return_storage_ptr__,diligent_spirv_cross *this,char (*ts) [6],
          TypedID<(diligent_spirv_cross::Types)0> *ts_1,char (*ts_2) [15])

{
  StringStream<4096UL,_4096UL> stream;
  StringStream<4096UL,_4096UL> SStack_1118;
  
  StringStream<4096UL,_4096UL>::StringStream(&SStack_1118);
  inner::
  join_helper<char_const(&)[6],diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>&,char_const(&)[15]>
            (&SStack_1118,(char (*) [6])this,(TypedID<(diligent_spirv_cross::Types)0> *)ts,
             (char (*) [15])ts_1);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)&SStack_1118);
  StringStream<4096UL,_4096UL>::~StringStream(&SStack_1118);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}